

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_3;
  PrefixUnaryExpressionSyntax *pPVar1;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  args_3 = deepClone(*(SyntaxNode **)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_30,args_2,
                      (ExpressionSyntax *)args_3);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PrefixUnaryExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PrefixUnaryExpressionSyntax>(
        node.kind,
        node.operatorToken.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.operand, alloc)
    );
}